

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

void __thiscall ObjTable<Test>::resize(ObjTable<Test> *this,size_t a_size)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  pointer ppVar5;
  unsigned_long local_58;
  _Self local_28;
  iterator end;
  iterator it;
  size_t a_size_local;
  ObjTable<Test> *this_local;
  
  std::vector<Test,_std::allocator<Test>_>::resize
            (&this->super_vector<Test,_std::allocator<Test>_>,a_size);
  if (this->min_sparse < a_size) {
    end = std::
          map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
          ::begin(&this->sparse_elements);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
         ::end(&this->sparse_elements);
    while( true ) {
      bVar1 = std::operator!=(&end,&local_28);
      bVar2 = false;
      if (bVar1) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
        bVar2 = ppVar5->first < a_size;
      }
      if (!bVar2) break;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
      pvVar4 = std::vector<Test,_std::allocator<Test>_>::operator[]
                         (&this->super_vector<Test,_std::allocator<Test>_>,ppVar3->first);
      pvVar4->value = (ppVar5->second).value;
      end = std::
            map<unsigned_long,Test,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
            ::erase_abi_cxx11_((map<unsigned_long,Test,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                                *)&this->sparse_elements,end);
    }
    bVar2 = std::operator==(&end,&local_28);
    if (bVar2) {
      local_58 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
      local_58 = ppVar5->first;
    }
    this->min_sparse = local_58;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }